

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<12,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  Matrix<float,_4,_4> *mat;
  Matrix<float,_4,_4> *mat_00;
  long lVar5;
  undefined4 uVar6;
  Vector<float,_3> res_3;
  Vector<float,_3> res;
  Vector<float,_3> res_5;
  Vector<float,_3> res_2;
  Vector<float,_3> res_1;
  Type in0;
  float afStack_150 [8];
  Vec4 *local_130;
  undefined8 local_128;
  undefined4 local_120;
  float local_118 [6];
  float local_100 [4];
  float local_f0 [6];
  Matrix<float,_4,_4> local_d8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Matrix<float,_4,_4> local_50;
  
  puVar1 = &local_98;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar6 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar6 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar5) = uVar6;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_98 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_90 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_88 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_80 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_78 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_70 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_68 = *(undefined8 *)evalCtx->in[3].m_data;
    uStack_60 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
    mat = (Matrix<float,_4,_4> *)0x4;
  }
  else {
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat4x4;
    mat = (Matrix<float,_4,_4> *)0x0;
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar2 * 4) = *(undefined4 *)((long)puVar3 + lVar2);
        lVar2 = lVar2 + 4;
      } while (lVar2 != 0x10);
      mat = (Matrix<float,_4,_4> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 4;
    } while (mat != (Matrix<float,_4,_4> *)0x4);
  }
  afStack_150[0] = 8.379437e-39;
  afStack_150[1] = 0.0;
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,4,4>
            (&local_50,(MatrixCaseUtils *)&local_98,mat);
  afStack_150[2] = local_50.m_data.m_data[0].m_data[0];
  afStack_150[3] = local_50.m_data.m_data[0].m_data[1];
  afStack_150[4] = local_50.m_data.m_data[0].m_data[2];
  local_118[3] = local_50.m_data.m_data[1].m_data[1];
  local_118[4] = local_50.m_data.m_data[1].m_data[2];
  local_118[5] = local_50.m_data.m_data[1].m_data[3];
  local_130 = (Vec4 *)0x0;
  local_128 = (ulong)local_128._4_4_ << 0x20;
  lVar2 = 0;
  do {
    *(float *)((long)&local_130 + lVar2 * 4) = afStack_150[lVar2 + 2] + local_118[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_118[0] = local_50.m_data.m_data[2].m_data[2];
  local_118[1] = local_50.m_data.m_data[2].m_data[3];
  local_118[2] = local_50.m_data.m_data[2].m_data[0];
  local_d8.m_data.m_data[0].m_data[0] = 0.0;
  local_d8.m_data.m_data[0].m_data[1] = 0.0;
  local_d8.m_data.m_data[0].m_data[2] = 0.0;
  lVar2 = 0;
  do {
    local_d8.m_data.m_data[0].m_data[lVar2] =
         *(float *)((long)&local_130 + lVar2 * 4) + local_118[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_150[7] = local_50.m_data.m_data[3].m_data[1];
  local_f0[0] = 0.0;
  local_f0[1] = 0.0;
  local_f0[2] = 0.0;
  lVar2 = 0;
  do {
    local_f0[lVar2] = local_d8.m_data.m_data[0].m_data[lVar2] + afStack_150[lVar2 + 5];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_150[0] = 8.379817e-39;
  afStack_150[1] = 0.0;
  sr::(anonymous_namespace)::MatrixCaseUtils::decrement<float,4,4>
            (&local_d8,(MatrixCaseUtils *)&local_98,mat_00);
  local_118[3] = local_d8.m_data.m_data[0].m_data[0];
  local_118[4] = local_d8.m_data.m_data[0].m_data[1];
  local_118[5] = local_d8.m_data.m_data[0].m_data[2];
  local_118[0] = local_d8.m_data.m_data[1].m_data[1];
  local_118[1] = local_d8.m_data.m_data[1].m_data[2];
  local_118[2] = local_d8.m_data.m_data[1].m_data[3];
  afStack_150[2] = 0.0;
  afStack_150[3] = 0.0;
  afStack_150[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_150[lVar2 + 2] = local_118[lVar2 + 3] + local_118[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_150[5] = local_d8.m_data.m_data[2].m_data[2];
  afStack_150[6] = local_d8.m_data.m_data[2].m_data[3];
  afStack_150[7] = local_d8.m_data.m_data[2].m_data[0];
  local_130 = (Vec4 *)0x0;
  local_128 = local_128 & 0xffffffff00000000;
  lVar2 = 0;
  do {
    *(float *)((long)&local_130 + lVar2 * 4) = afStack_150[lVar2 + 2] + afStack_150[lVar2 + 5];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_f0[3] = local_d8.m_data.m_data[3].m_data[3];
  local_f0[4] = local_d8.m_data.m_data[3].m_data[0];
  local_f0[5] = local_d8.m_data.m_data[3].m_data[1];
  local_100[0] = 0.0;
  local_100[1] = 0.0;
  local_100[2] = 0.0;
  lVar2 = 0;
  do {
    local_118[lVar2 + 6] = *(float *)((long)&local_130 + lVar2 * 4) + local_f0[lVar2 + 3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_150[2] = 0.0;
  afStack_150[3] = 0.0;
  afStack_150[4] = 0.0;
  lVar2 = 0;
  do {
    afStack_150[lVar2 + 2] = local_f0[lVar2] + local_118[lVar2 + 6];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_130 = &evalCtx->color;
  local_128 = 0x100000000;
  local_120 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_130 + lVar2 * 4)] = afStack_150[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(in0)) + reduceToVec3(decrement(in0));
	}